

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

void __thiscall Table::push_new_value_in_column(Table *this,int cnt,string *value)

{
  types tVar1;
  int iVar2;
  pointer ppVar3;
  pointer ppVar4;
  int iVar5;
  pointer ptVar6;
  pointer ppVar7;
  ulong uVar8;
  double local_20;
  
  ptVar6 = (this->columns).
           super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  tVar1 = ptVar6[cnt].
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>
          .super__Tuple_impl<1UL,_Table::types,_int>.super__Head_base<1UL,_Table::types,_false>.
          _M_head_impl;
  ptVar6 = ptVar6 + cnt;
  if (tVar1 == STRING) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(this->string_cols).
                 super__Vector_base<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start
                 [*(int *)&(ptVar6->
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>
                           ).super__Tuple_impl<1UL,_Table::types,_int>.super__Tuple_impl<2UL,_int>].
                 second,value);
    ppVar4 = (this->string_cols).
             super__Vector_base<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar2 = *(int *)&(this->columns).
                     super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[cnt].
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>
                     .super__Tuple_impl<1UL,_Table::types,_int>.super__Tuple_impl<2UL,_int>;
    uVar8 = (long)*(pointer *)
                   ((long)&ppVar4[iVar2].second.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl + 8) -
            *(long *)&ppVar4[iVar2].second.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl >> 5;
  }
  else {
    if (tVar1 == FLOAT) {
      iVar2 = *(int *)&(ptVar6->
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>
                       ).super__Tuple_impl<1UL,_Table::types,_int>.super__Tuple_impl<2UL,_int>;
      ppVar7 = (this->float_cols).
               super__Vector_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_20 = std::__cxx11::stod(value,(size_t *)0x0);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (&ppVar7[iVar2].second,&local_20);
      ptVar6 = (this->columns).
               super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar7 = (this->float_cols).
               super__Vector_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      if (tVar1 != INT) {
        std::operator<<((ostream *)&std::cerr,"push_new_value_in_column\n");
        exit(1);
      }
      iVar2 = *(int *)&(ptVar6->
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>
                       ).super__Tuple_impl<1UL,_Table::types,_int>.super__Tuple_impl<2UL,_int>;
      ppVar3 = (this->int_cols).
               super__Vector_base<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar5 = std::__cxx11::stoi(value,(size_t *)0x0,10);
      local_20 = (double)(long)iVar5;
      std::vector<long_long,_std::allocator<long_long>_>::emplace_back<long_long>
                (&ppVar3[iVar2].second,(longlong *)&local_20);
      ptVar6 = (this->columns).
               super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar7 = (pointer)(this->int_cols).
                        super__Vector_base<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
    }
    iVar2 = *(int *)&ptVar6[cnt].
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>
                     .super__Tuple_impl<1UL,_Table::types,_int>.super__Tuple_impl<2UL,_int>;
    uVar8 = (long)*(pointer *)
                   ((long)&ppVar7[iVar2].second.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl + 8) -
            *(long *)&ppVar7[iVar2].second.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl >> 3;
  }
  if ((ulong)(long)this->rows < uVar8) {
    this->rows = this->rows + 1;
  }
  return;
}

Assistant:

void push_new_value_in_column(int cnt, std::string value) {
        switch (std::get<1>(columns[cnt])) {
            case INT:
                int_cols[std::get<2>(columns[cnt])].second.push_back(std::stoi(value));
                if (int_cols[std::get<2>(columns[cnt])].second.size() > rows) rows++;
                break;
            case FLOAT:
                float_cols[std::get<2>(columns[cnt])].second.push_back(std::stod(value));
                if (float_cols[std::get<2>(columns[cnt])].second.size() > rows) rows++;
                break;
            case STRING:
                string_cols[std::get<2>(columns[cnt])].second.push_back(value);
                if (string_cols[std::get<2>(columns[cnt])].second.size() > rows) rows++;
                break;
            default:
                std::cerr << "push_new_value_in_column\n";
                exit(EXIT_FAILURE);
        }
    }